

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

Offset dg::pta::accumulateEVOffsets(ExtractValueInst *EV,DataLayout *DL)

{
  uint uVar1;
  Type *pTVar2;
  type tVar3;
  ulong uVar4;
  type tVar5;
  long lVar6;
  type tVar7;
  long lVar8;
  type tVar9;
  ulong uVar10;
  bool bVar11;
  TypeSize TVar12;
  TypeSize local_48;
  long local_38;
  
  tVar3 = Offset::UNKNOWN;
  uVar1 = *(uint *)(EV + 0x48);
  if ((ulong)uVar1 == 0) {
    tVar9 = 0;
  }
  else {
    local_38 = *(long *)(EV + 0x40);
    pTVar2 = (Type *)**(undefined8 **)(EV + -0x20);
    tVar9 = 0;
    lVar8 = 0;
    do {
      uVar10 = (ulong)*(uint *)(local_38 + lVar8);
      if (pTVar2[8] == (Type)0x10 && pTVar2 != (Type *)0x0) {
        lVar6 = llvm::DataLayout::getStructLayout((StructType *)DL);
        tVar7 = *(type *)(lVar6 + 0x10 + uVar10 * 8);
        tVar5 = tVar3;
        if (tVar9 < tVar3 - tVar7) {
          tVar5 = tVar7 + tVar9;
        }
        if (tVar3 == tVar7) {
          tVar5 = tVar3;
        }
        bVar11 = tVar9 == tVar3;
        tVar9 = tVar5;
        if (bVar11) {
          tVar9 = tVar3;
        }
      }
      else {
        TVar12 = llvm::DataLayout::getTypeAllocSize(DL,*(Type **)(pTVar2 + 0x18));
        local_48.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
        .Value = TVar12.super_LinearPolySize<llvm::TypeSize>.
                 super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        local_48.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
        .UnivariateDim =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        uVar4 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_48);
        tVar5 = uVar4 + uVar10;
        tVar7 = tVar3;
        if (tVar9 < tVar3 - tVar5) {
          tVar7 = tVar5 + tVar9;
        }
        if (tVar3 == tVar5) {
          tVar7 = tVar3;
        }
        bVar11 = tVar9 == tVar3;
        tVar9 = tVar7;
        if (bVar11) {
          tVar9 = tVar3;
        }
      }
      lVar6 = llvm::GetElementPtrInst::getTypeAtIndex(pTVar2,uVar10);
    } while ((lVar6 != 0) && (bVar11 = (ulong)uVar1 * 4 + -4 != lVar8, lVar8 = lVar8 + 4, bVar11));
  }
  return (Offset)tVar9;
}

Assistant:

Offset accumulateEVOffsets(const llvm::ExtractValueInst *EV,
                           const llvm::DataLayout &DL) {
    Offset off{0};
#if LLVM_VERSION_MAJOR >= 11
    llvm::Type *type = EV->getAggregateOperand()->getType();
#else
    llvm::CompositeType *type = llvm::dyn_cast<llvm::CompositeType>(
            EV->getAggregateOperand()->getType());
    assert(type && "Don't have composite type in extractvalue");
#endif

    for (unsigned idx : EV->getIndices()) {
        if (llvm::StructType *STy = llvm::dyn_cast<llvm::StructType>(type)) {
            assert(STy->indexValid(idx) && "Invalid index");
            const llvm::StructLayout *SL = DL.getStructLayout(STy);
            off += SL->getElementOffset(idx);
        } else {
            // array or vector, so just move in the array
            if (auto *arrTy = llvm::dyn_cast<llvm::ArrayType>(type)) {
                assert(idx < arrTy->getNumElements() && "Invalid index");
                off += idx + DL.getTypeAllocSize(arrTy->getElementType());
            } else {
                auto *vecTy = llvm::cast<llvm::VectorType>(type);
#if LLVM_VERSION_MAJOR >= 12
                assert(idx < vecTy->getElementCount().getFixedValue() &&
                       "Invalid index");
#else
                assert(idx < vecTy->getNumElements() && "Invalid index");
#endif
                off += idx + DL.getTypeAllocSize(vecTy->getElementType());
            }
        }

#if LLVM_VERSION_MAJOR >= 11
        if (!llvm::GetElementPtrInst::getTypeAtIndex(type, idx))
#else
        if (!llvm::dyn_cast<llvm::CompositeType>(type->getTypeAtIndex(idx)))
#endif
            break; // we're done
    }

    return off;
}